

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_output.cc
# Opt level: O0

void sample_output<trng::lcg64>(lcg64 *r,string *name)

{
  ulong uVar1;
  result_type rVar2;
  ostream *poVar3;
  lcg64 *in_RSI;
  int i;
  int local_14;
  
  while( true ) {
    uVar1 = std::__cxx11::string::length();
    if (0x1f < uVar1) break;
    std::__cxx11::string::operator+=((string *)in_RSI,' ');
  }
  std::operator<<((ostream *)&std::cout,(string *)in_RSI);
  for (local_14 = 0; local_14 < 0xf; local_14 = local_14 + 1) {
    rVar2 = trng::lcg64::operator()(in_RSI);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,rVar2);
    std::operator<<(poVar3,'\t');
  }
  rVar2 = trng::lcg64::operator()(in_RSI);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,rVar2);
  std::operator<<(poVar3,'\n');
  return;
}

Assistant:

void sample_output(R &r, std::string name) {
  while (name.length() < 32)
    name += ' ';
  std::cout << name;
  for (int i{0}; i < 15; ++i)
    std::cout << r() << '\t';
  std::cout << r() << '\n';
}